

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

void __thiscall embree::OBJMaterial::~OBJMaterial(OBJMaterial *this)

{
  OBJMaterial *in_RDI;
  
  ~OBJMaterial(in_RDI);
  SceneGraph::MaterialNode::operator_delete((void *)0x172d92);
  return;
}

Assistant:

~OBJMaterial() { // FIXME: destructor never called
    }